

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv1_cm_gears.c
# Opt level: O3

gears_t_conflict * glesv1_cm_gears_init(int win_width,int win_height)

{
  int iVar1;
  undefined8 in_RAX;
  gears_t_conflict *gears;
  void *pvVar2;
  _func_void_GLenum_GLuint *p_Var3;
  _func_void_GLenum_GLsizeiptr_GLvoid_ptr_GLenum *p_Var4;
  _func_void_GLbitfield *p_Var5;
  _func_void_GLfloat_GLfloat_GLfloat_GLfloat *p_Var6;
  _func_void_GLenum *p_Var7;
  _func_void_GLsizei_GLuint_ptr *p_Var8;
  _func_void_GLenum_GLint_GLsizei *p_Var9;
  _func_void_GLfloat_GLfloat_GLfloat_GLfloat_GLfloat_GLfloat *p_Var10;
  _func_GLenum_varargs *p_Var11;
  _func_GLubyte_ptr_GLenum *p_Var12;
  _func_void_GLenum_GLenum_GLfloat_ptr *p_Var13;
  _func_void_varargs *p_Var14;
  _func_void_GLenum_GLsizei_GLvoid_ptr *p_Var15;
  _func_void_GLint_GLenum_GLsizei_GLvoid_ptr *p_Var16;
  _func_void_GLenum_GLenum_GLint *p_Var17;
  _func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_GLvoid_ptr *p_Var18;
  _func_void_GLfloat_GLfloat_GLfloat *p_Var19;
  _func_void_GLint_GLint_GLsizei_GLsizei *p_Var20;
  char *pcVar21;
  uchar *image_data;
  char *__format;
  float tooth_depth;
  int texture_height;
  int texture_width;
  
  _texture_height = in_RAX;
  gears = (gears_t_conflict *)calloc(1,0x108);
  if (gears == (gears_t_conflict *)0x0) {
    puts("calloc gears failed");
    return (gears_t_conflict *)0x0;
  }
  pvVar2 = (void *)dlopen("libGL.so.1",1);
  gears->lib_handle = pvVar2;
  if (pvVar2 == (void *)0x0) {
    __format = "%s library not found\n";
    pcVar21 = "libGL.so.1";
  }
  else {
    p_Var3 = (_func_void_GLenum_GLuint *)dlsym(pvVar2,"glBindBuffer");
    gears->glBindBuffer = p_Var3;
    if (p_Var3 == (_func_void_GLenum_GLuint *)0x0) {
      __format = "%s not found\n";
      pcVar21 = "glBindBuffer";
    }
    else {
      p_Var4 = (_func_void_GLenum_GLsizeiptr_GLvoid_ptr_GLenum *)
               dlsym(gears->lib_handle,"glBufferData");
      gears->glBufferData = p_Var4;
      if (p_Var4 == (_func_void_GLenum_GLsizeiptr_GLvoid_ptr_GLenum *)0x0) {
        __format = "%s not found\n";
        pcVar21 = "glBufferData";
      }
      else {
        p_Var5 = (_func_void_GLbitfield *)dlsym(gears->lib_handle,"glClear");
        gears->glClear = p_Var5;
        if (p_Var5 == (_func_void_GLbitfield *)0x0) {
          __format = "%s not found\n";
          pcVar21 = "glClear";
        }
        else {
          p_Var6 = (_func_void_GLfloat_GLfloat_GLfloat_GLfloat *)
                   dlsym(gears->lib_handle,"glClearColor");
          gears->glClearColor = p_Var6;
          if (p_Var6 == (_func_void_GLfloat_GLfloat_GLfloat_GLfloat *)0x0) {
            __format = "%s not found\n";
            pcVar21 = "glClearColor";
          }
          else {
            p_Var7 = (_func_void_GLenum *)dlsym(gears->lib_handle,"glDisable");
            gears->glDisable = p_Var7;
            if (p_Var7 == (_func_void_GLenum *)0x0) {
              __format = "%s not found\n";
              pcVar21 = "glDisable";
            }
            else {
              p_Var7 = (_func_void_GLenum *)dlsym(gears->lib_handle,"glDisableClientState");
              gears->glDisableClientState = p_Var7;
              if (p_Var7 == (_func_void_GLenum *)0x0) {
                __format = "%s not found\n";
                pcVar21 = "glDisableClientState";
              }
              else {
                p_Var8 = (_func_void_GLsizei_GLuint_ptr *)dlsym(gears->lib_handle,"glDeleteBuffers")
                ;
                gears->glDeleteBuffers = p_Var8;
                if (p_Var8 == (_func_void_GLsizei_GLuint_ptr *)0x0) {
                  __format = "%s not found\n";
                  pcVar21 = "glDeleteBuffers";
                }
                else {
                  p_Var9 = (_func_void_GLenum_GLint_GLsizei *)
                           dlsym(gears->lib_handle,"glDrawArrays");
                  gears->glDrawArrays = p_Var9;
                  if (p_Var9 == (_func_void_GLenum_GLint_GLsizei *)0x0) {
                    __format = "%s not found\n";
                    pcVar21 = "glDrawArrays";
                  }
                  else {
                    p_Var7 = (_func_void_GLenum *)dlsym(gears->lib_handle,"glEnable");
                    gears->glEnable = p_Var7;
                    if (p_Var7 == (_func_void_GLenum *)0x0) {
                      __format = "%s not found\n";
                      pcVar21 = "glEnable";
                    }
                    else {
                      p_Var7 = (_func_void_GLenum *)dlsym(gears->lib_handle,"glEnableClientState");
                      gears->glEnableClientState = p_Var7;
                      if (p_Var7 == (_func_void_GLenum *)0x0) {
                        __format = "%s not found\n";
                        pcVar21 = "glEnableClientState";
                      }
                      else {
                        p_Var10 = (_func_void_GLfloat_GLfloat_GLfloat_GLfloat_GLfloat_GLfloat *)
                                  dlsym(gears->lib_handle,"glFrustumf");
                        gears->glFrustumf = p_Var10;
                        if (p_Var10 ==
                            (_func_void_GLfloat_GLfloat_GLfloat_GLfloat_GLfloat_GLfloat *)0x0) {
                          __format = "%s not found\n";
                          pcVar21 = "glFrustumf";
                        }
                        else {
                          p_Var8 = (_func_void_GLsizei_GLuint_ptr *)
                                   dlsym(gears->lib_handle,"glGenBuffers");
                          gears->glGenBuffers = p_Var8;
                          if (p_Var8 == (_func_void_GLsizei_GLuint_ptr *)0x0) {
                            __format = "%s not found\n";
                            pcVar21 = "glGenBuffers";
                          }
                          else {
                            p_Var11 = (_func_GLenum_varargs *)dlsym(gears->lib_handle,"glGetError");
                            gears->glGetError = p_Var11;
                            if (p_Var11 == (_func_GLenum_varargs *)0x0) {
                              __format = "%s not found\n";
                              pcVar21 = "glGetError";
                            }
                            else {
                              p_Var12 = (_func_GLubyte_ptr_GLenum *)
                                        dlsym(gears->lib_handle,"glGetString");
                              gears->glGetString = p_Var12;
                              if (p_Var12 == (_func_GLubyte_ptr_GLenum *)0x0) {
                                __format = "%s not found\n";
                                pcVar21 = "glGetString";
                              }
                              else {
                                p_Var13 = (_func_void_GLenum_GLenum_GLfloat_ptr *)
                                          dlsym(gears->lib_handle,"glLightfv");
                                gears->glLightfv = p_Var13;
                                if (p_Var13 == (_func_void_GLenum_GLenum_GLfloat_ptr *)0x0) {
                                  __format = "%s not found\n";
                                  pcVar21 = "glLightfv";
                                }
                                else {
                                  p_Var14 = (_func_void_varargs *)
                                            dlsym(gears->lib_handle,"glLoadIdentity");
                                  gears->glLoadIdentity = p_Var14;
                                  if (p_Var14 == (_func_void_varargs *)0x0) {
                                    __format = "%s not found\n";
                                    pcVar21 = "glLoadIdentity";
                                  }
                                  else {
                                    p_Var13 = (_func_void_GLenum_GLenum_GLfloat_ptr *)
                                              dlsym(gears->lib_handle,"glMaterialfv");
                                    gears->glMaterialfv = p_Var13;
                                    if (p_Var13 == (_func_void_GLenum_GLenum_GLfloat_ptr *)0x0) {
                                      __format = "%s not found\n";
                                      pcVar21 = "glMaterialfv";
                                    }
                                    else {
                                      p_Var7 = (_func_void_GLenum *)
                                               dlsym(gears->lib_handle,"glMatrixMode");
                                      gears->glMatrixMode = p_Var7;
                                      if (p_Var7 == (_func_void_GLenum *)0x0) {
                                        __format = "%s not found\n";
                                        pcVar21 = "glMatrixMode";
                                      }
                                      else {
                                        p_Var15 = (_func_void_GLenum_GLsizei_GLvoid_ptr *)
                                                  dlsym(gears->lib_handle,"glNormalPointer");
                                        gears->glNormalPointer = p_Var15;
                                        if (p_Var15 == (_func_void_GLenum_GLsizei_GLvoid_ptr *)0x0)
                                        {
                                          __format = "%s not found\n";
                                          pcVar21 = "glNormalPointer";
                                        }
                                        else {
                                          p_Var14 = (_func_void_varargs *)
                                                    dlsym(gears->lib_handle,"glPopMatrix");
                                          gears->glPopMatrix = p_Var14;
                                          if (p_Var14 == (_func_void_varargs *)0x0) {
                                            __format = "%s not found\n";
                                            pcVar21 = "glPopMatrix";
                                          }
                                          else {
                                            p_Var14 = (_func_void_varargs *)
                                                      dlsym(gears->lib_handle,"glPushMatrix");
                                            gears->glPushMatrix = p_Var14;
                                            if (p_Var14 == (_func_void_varargs *)0x0) {
                                              __format = "%s not found\n";
                                              pcVar21 = "glPushMatrix";
                                            }
                                            else {
                                              p_Var6 = (_func_void_GLfloat_GLfloat_GLfloat_GLfloat *
                                                       )dlsym(gears->lib_handle,"glRotatef");
                                              gears->glRotatef = p_Var6;
                                              if (p_Var6 == (
                                                  _func_void_GLfloat_GLfloat_GLfloat_GLfloat *)0x0)
                                              {
                                                __format = "%s not found\n";
                                                pcVar21 = "glRotatef";
                                              }
                                              else {
                                                p_Var16 = (
                                                  _func_void_GLint_GLenum_GLsizei_GLvoid_ptr *)
                                                  dlsym(gears->lib_handle,"glTexCoordPointer");
                                                gears->glTexCoordPointer = p_Var16;
                                                if (p_Var16 ==
                                                    (_func_void_GLint_GLenum_GLsizei_GLvoid_ptr *)
                                                    0x0) {
                                                  __format = "%s not found\n";
                                                  pcVar21 = "glTexCoordPointer";
                                                }
                                                else {
                                                  p_Var17 = (_func_void_GLenum_GLenum_GLint *)
                                                            dlsym(gears->lib_handle,"glTexEnvi");
                                                  gears->glTexEnvi = p_Var17;
                                                  if (p_Var17 ==
                                                      (_func_void_GLenum_GLenum_GLint *)0x0) {
                                                    __format = "%s not found\n";
                                                    pcVar21 = "glTexEnvi";
                                                  }
                                                  else {
                                                    p_Var18 = (
                                                  _func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_GLvoid_ptr
                                                  *)dlsym(gears->lib_handle,"glTexImage2D");
                                                  gears->glTexImage2D = p_Var18;
                                                  if (p_Var18 ==
                                                      (
                                                  _func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_GLvoid_ptr
                                                  *)0x0) {
                                                    __format = "%s not found\n";
                                                    pcVar21 = "glTexImage2D";
                                                  }
                                                  else {
                                                    p_Var17 = (_func_void_GLenum_GLenum_GLint *)
                                                              dlsym(gears->lib_handle,
                                                                    "glTexParameteri");
                                                    gears->glTexParameteri = p_Var17;
                                                    if (p_Var17 ==
                                                        (_func_void_GLenum_GLenum_GLint *)0x0) {
                                                      __format = "%s not found\n";
                                                      pcVar21 = "glTexParameteri";
                                                    }
                                                    else {
                                                      p_Var19 = (_func_void_GLfloat_GLfloat_GLfloat
                                                                 *)dlsym(gears->lib_handle,
                                                                         "glTranslatef");
                                                      gears->glTranslatef = p_Var19;
                                                      if (p_Var19 ==
                                                          (_func_void_GLfloat_GLfloat_GLfloat *)0x0)
                                                      {
                                                        __format = "%s not found\n";
                                                        pcVar21 = "glTranslatef";
                                                      }
                                                      else {
                                                        p_Var16 = (
                                                  _func_void_GLint_GLenum_GLsizei_GLvoid_ptr *)
                                                  dlsym(gears->lib_handle,"glVertexPointer");
                                                  gears->glVertexPointer = p_Var16;
                                                  if (p_Var16 ==
                                                      (_func_void_GLint_GLenum_GLsizei_GLvoid_ptr *)
                                                      0x0) {
                                                    __format = "%s not found\n";
                                                    pcVar21 = "glVertexPointer";
                                                  }
                                                  else {
                                                    p_Var20 = (
                                                  _func_void_GLint_GLint_GLsizei_GLsizei *)
                                                  dlsym(gears->lib_handle);
                                                  gears->glViewport = p_Var20;
                                                  if (p_Var20 !=
                                                      (_func_void_GLint_GLint_GLsizei_GLsizei *)0x0)
                                                  {
                                                    (*gears->glEnable)(0xb71);
                                                    (*gears->glEnable)(0xba1);
                                                    (*gears->glEnable)(0xb50);
                                                    (*gears->glEnable)(0x4000);
                                                    pcVar21 = getenv("TEXTURE");
                                                    image_load(pcVar21,(uchar *)0x0,&texture_width,
                                                               &texture_height);
                                                    image_data = (uchar *)malloc((long)(
                                                  texture_width * texture_height * 4));
                                                  if (image_data == (uchar *)0x0) {
                                                    puts("malloc texture_data failed");
                                                  }
                                                  else {
                                                    pcVar21 = getenv("TEXTURE");
                                                    image_load(pcVar21,image_data,&texture_width,
                                                               &texture_height);
                                                    (*gears->glTexImage2D)
                                                              (0xde1,0,0x1908,texture_width,
                                                               texture_height,0,0x1908,0x1401,
                                                               image_data);
                                                    free(image_data);
                                                    (*gears->glTexParameteri)(0xde1,0x2801,0x2601);
                                                    (*gears->glTexParameteri)(0xde1,0x2800,0x2601);
                                                    (*gears->glTexEnvi)(0x2300,0x2200,0x2101);
                                                    tooth_depth = 1.0;
                                                    (*gears->glClearColor)(0.0,0.0,0.0,1.0);
                                                    (*gears->glViewport)(0,0,win_width,win_height);
                                                    iVar1 = create_gear(gears,0,1.0,4.0,1.0,0x14,
                                                                        tooth_depth);
                                                    if (((iVar1 == 0) &&
                                                        (iVar1 = create_gear(gears,1,0.5,2.0,2.0,10,
                                                                             tooth_depth),
                                                        iVar1 == 0)) &&
                                                       (iVar1 = create_gear(gears,2,1.3,2.0,0.5,10,
                                                                            tooth_depth), iVar1 == 0
                                                       )) {
                                                      (*gears->glMatrixMode)(0x1701);
                                                      (*gears->glFrustumf)
                                                                (-1.0,1.0,-(float)win_height /
                                                                          (float)win_width,
                                                                 (float)win_height /
                                                                 (float)win_width,5.0,60.0);
                                                      (*gears->glMatrixMode)(0x1700);
                                                      return gears;
                                                    }
                                                  }
                                                  goto LAB_00104621;
                                                  }
                                                  __format = "%s not found\n";
                                                  pcVar21 = "glViewport";
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  printf(__format,pcVar21);
LAB_00104621:
  glesv1_cm_gears_term(gears);
  return (gears_t_conflict *)0x0;
}

Assistant:

static gears_t *glesv1_cm_gears_init(int win_width, int win_height)
{
  gears_t *gears = NULL;
  int texture_width, texture_height;
  void *texture_data = NULL;
  const float zNear = 5, zFar = 60;

  gears = calloc(1, sizeof(gears_t));
  if (!gears) {
    printf("calloc gears failed\n");
    return NULL;
  }

  gears->lib_handle = dlopen(GLESV1_CM_LIB, RTLD_LAZY);
  if (!gears->lib_handle) {
    printf("%s library not found\n", GLESV1_CM_LIB);
    goto out;
  }

  #define DLSYM(sym) gears->sym = dlsym(gears->lib_handle, #sym); \
  if (!gears->sym) { \
    printf("%s not found\n", #sym); \
    goto out; \
  }

  DLSYM(glBindBuffer);
  DLSYM(glBufferData);
  DLSYM(glClear);
  DLSYM(glClearColor);
  DLSYM(glDisable);
  DLSYM(glDisableClientState);
  DLSYM(glDeleteBuffers);
  DLSYM(glDrawArrays);
  DLSYM(glEnable);
  DLSYM(glEnableClientState);
  DLSYM(glFrustumf);
  DLSYM(glGenBuffers);
  DLSYM(glGetError);
  DLSYM(glGetString);
  DLSYM(glLightfv);
  DLSYM(glLoadIdentity);
  DLSYM(glMaterialfv);
  DLSYM(glMatrixMode);
  DLSYM(glNormalPointer);
  DLSYM(glPopMatrix);
  DLSYM(glPushMatrix);
  DLSYM(glRotatef);
  DLSYM(glTexCoordPointer);
  DLSYM(glTexEnvi);
  DLSYM(glTexImage2D);
  DLSYM(glTexParameteri);
  DLSYM(glTranslatef);
  DLSYM(glVertexPointer);
  DLSYM(glViewport);

  gears->glEnable(GL_DEPTH_TEST);
  gears->glEnable(GL_NORMALIZE);
  gears->glEnable(GL_LIGHTING);
  gears->glEnable(GL_LIGHT0);

  /* load texture */

  image_load(getenv("TEXTURE"), NULL, &texture_width, &texture_height);

  texture_data = malloc(texture_width * texture_height * 4);
  if (!texture_data) {
    printf("malloc texture_data failed\n");
    goto out;
  }

  image_load(getenv("TEXTURE"), texture_data, &texture_width, &texture_height);

  gears->glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, texture_width, texture_height, 0, GL_RGBA, GL_UNSIGNED_BYTE, texture_data);

  free(texture_data);

  gears->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
  gears->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
  gears->glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_DECAL);

  /* set clear values, set viewport */

  gears->glClearColor(0, 0, 0, 1);

  gears->glViewport(0, 0, win_width, win_height);

  /* create gears */

  if (create_gear(gears, GEAR0, 1.0, 4.0, 1.0, 20, 0.7)) {
    goto out;
  }

  if (create_gear(gears, GEAR1, 0.5, 2.0, 2.0, 10, 0.7)) {
    goto out;
  }

  if (create_gear(gears, GEAR2, 1.3, 2.0, 0.5, 10, 0.7)) {
    goto out;
  }

  gears->glMatrixMode(GL_PROJECTION);

  gears->glFrustumf(-1, 1, -(float)win_height/win_width, (float)win_height/win_width, zNear, zFar);

  gears->glMatrixMode(GL_MODELVIEW);

  return gears;

out:
  glesv1_cm_gears_term(gears);
  return NULL;
}